

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O3

void self_destruct(j_common_ptr cinfo)

{
  int pool;
  int pool_id;
  bool bVar1;
  
  pool_id = 1;
  do {
    free_pool(cinfo,pool_id);
    bVar1 = pool_id != 0;
    pool_id = pool_id + -1;
  } while (bVar1);
  jpeg_free_small(cinfo,cinfo->mem,0xa8);
  cinfo->mem = (jpeg_memory_mgr *)0x0;
  jpeg_mem_term(cinfo);
  return;
}

Assistant:

METHODDEF(void)
self_destruct (j_common_ptr cinfo)
{
  int pool;

  /* Close all backing store, release all memory.
   * Releasing pools in reverse order might help avoid fragmentation
   * with some (brain-damaged) malloc libraries.
   */
  for (pool = JPOOL_NUMPOOLS-1; pool >= JPOOL_PERMANENT; pool--) {
    free_pool(cinfo, pool);
  }

  /* Release the memory manager control block too. */
  jpeg_free_small(cinfo, (void *) cinfo->mem, SIZEOF(my_memory_mgr));
  cinfo->mem = NULL;		/* ensures I will be called only once */

  jpeg_mem_term(cinfo);		/* system-dependent cleanup */
}